

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadContents(ColladaParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  Logger *pLVar4;
  undefined4 extraout_var_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_00;
  basic_formatter *this_01;
  char *local_1c0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_40;
  char *local_20;
  char *version;
  ColladaParser *pCStack_10;
  int attrib;
  ColladaParser *this_local;
  
  pCStack_10 = this;
  while (uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (uVar2 & 1) != 0) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar3 == 1) {
      bVar1 = IsElement(this,"COLLADA");
      if (bVar1) {
        version._4_4_ = TestAttribute(this,"version");
        if (version._4_4_ != 0xffffffff) {
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)version._4_4_);
          local_20 = (char *)CONCAT44(extraout_var,iVar3);
          iVar3 = strncmp(local_20,"1.5",3);
          if (iVar3 == 0) {
            this->mFormat = FV_1_5_n;
            pLVar4 = DefaultLogger::get();
            Logger::debug(pLVar4,"Collada schema version is 1.5.n");
          }
          else {
            iVar3 = strncmp(local_20,"1.4",3);
            if (iVar3 == 0) {
              this->mFormat = FV_1_4_n;
              pLVar4 = DefaultLogger::get();
              Logger::debug(pLVar4,"Collada schema version is 1.4.n");
            }
            else {
              iVar3 = strncmp(local_20,"1.3",3);
              if (iVar3 == 0) {
                this->mFormat = FV_1_3_n;
                pLVar4 = DefaultLogger::get();
                Logger::debug(pLVar4,"Collada schema version is 1.3.n");
              }
            }
          }
        }
        ReadStructure(this);
      }
      else {
        pLVar4 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[26]>(&local_1b8,(char (*) [26])"Ignoring global element <");
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        local_1c0 = (char *)CONCAT44(extraout_var_00,iVar3);
        this_00 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_1b8,&local_1c0);
        this_01 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(this_00,(char (*) [3])0xa8483a);
        Formatter::basic_formatter::operator_cast_to_string(&local_40,this_01);
        Logger::debug(pLVar4,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_1b8);
        SkipElement(this);
      }
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadContents()
{
    while (mReader->read())
    {
        // handle the root element "COLLADA"
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("COLLADA"))
            {
                // check for 'version' attribute
                const int attrib = TestAttribute("version");
                if (attrib != -1) {
                    const char* version = mReader->getAttributeValue(attrib);

                    if (!::strncmp(version, "1.5", 3)) {
                        mFormat = FV_1_5_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.5.n");
                    }
                    else if (!::strncmp(version, "1.4", 3)) {
                        mFormat = FV_1_4_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.4.n");
                    }
                    else if (!::strncmp(version, "1.3", 3)) {
                        mFormat = FV_1_3_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.3.n");
                    }
                }

                ReadStructure();
            }
            else
            {
                ASSIMP_LOG_DEBUG_F("Ignoring global element <", mReader->getNodeName(), ">.");
                SkipElement();
            }
        }
        else
        {
            // skip everything else silently
        }
    }
}